

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode libcurl_generate_mime_part(CURL *curl,GlobalConfig *config,tool_mime *part,int mimeno)

{
  uint local_7c;
  char *pcStack_78;
  int slistno;
  char *escaped_5;
  char *escaped_4;
  char *escaped_3;
  char *escaped_2;
  char *escaped_1;
  char *escaped;
  char *filename;
  char *data;
  CURLcode local_30;
  int submimeno;
  CURLcode ret;
  int mimeno_local;
  tool_mime *part_local;
  GlobalConfig *config_local;
  CURL *curl_local;
  
  local_30 = CURLE_OK;
  data._4_4_ = 0;
  filename = (char *)0x0;
  escaped = part->filename;
  submimeno = mimeno;
  _ret = part;
  part_local = (tool_mime *)config;
  config_local = (GlobalConfig *)curl;
  if (part->prev != (tool_mime *)0x0) {
    local_30 = libcurl_generate_mime_part(curl,config,part->prev,mimeno);
  }
  if (local_30 == CURLE_OK) {
    local_30 = easysrc_addf(&easysrc_code,"part%d = curl_mime_addpart(mime%d);",
                            (ulong)(uint)submimeno,(ulong)(uint)submimeno);
  }
  if (local_30 == CURLE_OK) {
    switch(_ret->kind) {
    case TOOLMIME_PARTS:
      local_30 = libcurl_generate_mime
                           (config_local,(GlobalConfig *)part_local,_ret,(int *)((long)&data + 4));
      if ((local_30 == CURLE_OK) &&
         (local_30 = easysrc_addf(&easysrc_code,"curl_mime_subparts(part%d, mime%d);",
                                  (ulong)(uint)submimeno,(ulong)data._4_4_), local_30 == CURLE_OK))
      {
        local_30 = easysrc_addf(&easysrc_code,"mime%d = NULL;",(ulong)data._4_4_);
      }
      break;
    case TOOLMIME_DATA:
      filename = _ret->data;
      escaped_1 = c_escape(filename,-1);
      local_30 = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                              (ulong)(uint)submimeno,escaped_1);
      free(escaped_1);
      break;
    case TOOLMIME_FILE:
    case TOOLMIME_FILEDATA:
      escaped_2 = c_escape(_ret->data,-1);
      local_30 = easysrc_addf(&easysrc_code,"curl_mime_filedata(part%d, \"%s\");",
                              (ulong)(uint)submimeno,escaped_2);
      if (((_ret->kind == TOOLMIME_FILEDATA) && (escaped == (char *)0x0)) && (local_30 == CURLE_OK))
      {
        local_30 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, NULL);",
                                (ulong)(uint)submimeno);
      }
      free(escaped_2);
      break;
    case TOOLMIME_STDIN:
      if (escaped == (char *)0x0) {
        escaped = "-";
      }
    case TOOLMIME_STDINDATA:
      local_30 = easysrc_addf(&easysrc_code,
                              "curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
                              (ulong)(uint)submimeno);
      if (local_30 == CURLE_OK) {
        local_30 = easysrc_addf(&easysrc_code,
                                "                  (curl_seek_callback) fseek, NULL, stdin);");
      }
    }
    if ((local_30 == CURLE_OK) && (_ret->encoder != (char *)0x0)) {
      escaped_3 = c_escape(_ret->encoder,-1);
      local_30 = easysrc_addf(&easysrc_code,"curl_mime_encoder(part%d, \"%s\");",
                              (ulong)(uint)submimeno,escaped_3);
      free(escaped_3);
    }
    if ((local_30 == CURLE_OK) && (escaped != (char *)0x0)) {
      escaped_4 = c_escape(escaped,-1);
      local_30 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, \"%s\");",
                              (ulong)(uint)submimeno,escaped_4);
      free(escaped_4);
    }
    if ((local_30 == CURLE_OK) && (_ret->name != (char *)0x0)) {
      escaped_5 = c_escape(_ret->name,-1);
      local_30 = easysrc_addf(&easysrc_code,"curl_mime_name(part%d, \"%s\");",(ulong)(uint)submimeno
                              ,escaped_5);
      free(escaped_5);
    }
    if ((local_30 == CURLE_OK) && (_ret->type != (char *)0x0)) {
      pcStack_78 = c_escape(_ret->type,-1);
      local_30 = easysrc_addf(&easysrc_code,"curl_mime_type(part%d, \"%s\");",(ulong)(uint)submimeno
                              ,pcStack_78);
      free(pcStack_78);
    }
    if ((((local_30 == CURLE_OK) && (_ret->headers != (curl_slist *)0x0)) &&
        (local_30 = libcurl_generate_slist(_ret->headers,(int *)&local_7c), local_30 == CURLE_OK))
       && (local_30 = easysrc_addf(&easysrc_code,"curl_mime_headers(part%d, slist%d, 1);",
                                   (ulong)(uint)submimeno,(ulong)local_7c), local_30 == CURLE_OK)) {
      local_30 = easysrc_addf(&easysrc_code,"slist%d = NULL;",(ulong)local_7c);
    }
    curl_local._4_4_ = local_30;
  }
  else {
    curl_local._4_4_ = local_30;
  }
  return curl_local._4_4_;
}

Assistant:

static CURLcode libcurl_generate_mime_part(CURL *curl,
                                           struct GlobalConfig *config,
                                           struct tool_mime *part,
                                           int mimeno)
{
  CURLcode ret = CURLE_OK;
  int submimeno = 0;
  const char *data = NULL;
  const char *filename = part->filename;

  /* Parts are linked in reverse order. */
  if(part->prev)
    ret = libcurl_generate_mime_part(curl, config, part->prev, mimeno);

  /* Create the part. */
  if(!ret)
    ret = easysrc_addf(&easysrc_code, "part%d = curl_mime_addpart(mime%d);",
                       mimeno, mimeno);
  if(ret)
    return ret;

  switch(part->kind) {
  case TOOLMIME_PARTS:
    ret = libcurl_generate_mime(curl, config, part, &submimeno);
    if(!ret) {
      ret = easysrc_addf(&easysrc_code, "curl_mime_subparts(part%d, mime%d);",
                         mimeno, submimeno);
      if(!ret)
        /* Avoid freeing in CLEAN. */
        ret = easysrc_addf(&easysrc_code,
                           "mime%d = NULL;", submimeno);
    }
    break;

  case TOOLMIME_DATA:
    data = part->data;
    if(!ret) {
      char *escaped = c_escape(data, ZERO_TERMINATED);
      ret =
        easysrc_addf(&easysrc_code,
                     "curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                     mimeno, escaped);
      free(escaped);
    }
    break;

  case TOOLMIME_FILE:
  case TOOLMIME_FILEDATA: {
    char *escaped = c_escape(part->data, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code,
                       "curl_mime_filedata(part%d, \"%s\");", mimeno, escaped);
    if(part->kind == TOOLMIME_FILEDATA && !filename && !ret) {
      ret = easysrc_addf(&easysrc_code,
                         "curl_mime_filename(part%d, NULL);", mimeno);
    }
    free(escaped);
    break;
  }

  case TOOLMIME_STDIN:
    if(!filename)
      filename = "-";
    FALLTHROUGH();
  case TOOLMIME_STDINDATA:
    /* Can only be reading stdin in the current context. */
    ret = easysrc_addf(&easysrc_code, "curl_mime_data_cb(part%d, -1, "
                       "(curl_read_callback) fread, \\", mimeno);
    if(!ret)
      ret = easysrc_addf(&easysrc_code, "                  "
                         "(curl_seek_callback) fseek, NULL, stdin);");
    break;
  default:
    /* Other cases not possible in this context. */
    break;
  }

  if(!ret && part->encoder) {
    char *escaped = c_escape(part->encoder, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code, "curl_mime_encoder(part%d, \"%s\");",
                       mimeno, escaped);
    free(escaped);
  }

  if(!ret && filename) {
    char *escaped = c_escape(filename, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code, "curl_mime_filename(part%d, \"%s\");",
                       mimeno, escaped);
    free(escaped);
  }

  if(!ret && part->name) {
    char *escaped = c_escape(part->name, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code, "curl_mime_name(part%d, \"%s\");",
                       mimeno, escaped);
    free(escaped);
  }

  if(!ret && part->type) {
    char *escaped = c_escape(part->type, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code, "curl_mime_type(part%d, \"%s\");",
                       mimeno, escaped);
    free(escaped);
  }

  if(!ret && part->headers) {
    int slistno;

    ret = libcurl_generate_slist(part->headers, &slistno);
    if(!ret) {
      ret = easysrc_addf(&easysrc_code,
                         "curl_mime_headers(part%d, slist%d, 1);",
                         mimeno, slistno);
      if(!ret)
        ret = easysrc_addf(&easysrc_code,
                           "slist%d = NULL;", slistno); /* Prevent CLEANing. */
    }
  }

  return ret;
}